

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

void writefv(FILE *f,char *fmt,__va_list_tag *v)

{
  char cVar1;
  undefined4 uVar2;
  int x;
  byte *pbVar3;
  undefined4 *puVar4;
  int *piVar5;
  uint uVar6;
  
  do {
    do {
      cVar1 = *fmt;
      if (cVar1 == '\0') {
        return;
      }
      fmt = fmt + 1;
    } while (cVar1 == ' ');
    if (cVar1 == '4') {
      uVar6 = v->gp_offset;
      if ((ulong)uVar6 < 0x29) {
        piVar5 = (int *)((ulong)uVar6 + (long)v->reg_save_area);
        v->gp_offset = uVar6 + 8;
      }
      else {
        piVar5 = (int *)v->overflow_arg_area;
        v->overflow_arg_area = piVar5 + 2;
      }
      x = *piVar5;
      write8(f,x);
      write8(f,x >> 8);
      write8(f,x >> 0x10);
      uVar6 = x >> 0x18;
    }
    else if (cVar1 == '2') {
      uVar6 = v->gp_offset;
      if ((ulong)uVar6 < 0x29) {
        puVar4 = (undefined4 *)((ulong)uVar6 + (long)v->reg_save_area);
        v->gp_offset = uVar6 + 8;
      }
      else {
        puVar4 = (undefined4 *)v->overflow_arg_area;
        v->overflow_arg_area = puVar4 + 2;
      }
      uVar2 = *puVar4;
      write8(f,(int)(short)uVar2);
      uVar6 = (uint)(char)((uint)uVar2 >> 8);
    }
    else {
      if (cVar1 != '1') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                      ,0xe04,"void writefv(FILE *, char *, struct __va_list_tag *)");
      }
      uVar6 = v->gp_offset;
      if ((ulong)uVar6 < 0x29) {
        pbVar3 = (byte *)((ulong)uVar6 + (long)v->reg_save_area);
        v->gp_offset = uVar6 + 8;
      }
      else {
        pbVar3 = (byte *)v->overflow_arg_area;
        v->overflow_arg_area = pbVar3 + 8;
      }
      uVar6 = (uint)*pbVar3;
    }
    write8(f,uVar6);
  } while( true );
}

Assistant:

static void writefv(FILE *f, char *fmt, va_list v)
{
   while (*fmt) {
      switch (*fmt++) {
         case ' ': break;
         case '1': { uint8 x = va_arg(v, int); write8(f,x); break; }
         case '2': { int16 x = va_arg(v, int); write8(f,x); write8(f,x>>8); break; }
         case '4': { int32 x = va_arg(v, int); write8(f,x); write8(f,x>>8); write8(f,x>>16); write8(f,x>>24); break; }
         default:
            assert(0);
            va_end(v);
            return;
      }
   }
}